

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.c
# Opt level: O1

int main(int argc,char **args)

{
  char *file;
  size_t size_00;
  uint32_t *memory;
  int iVar1;
  uint uVar2;
  uint uVar3;
  light_pcapng p0;
  _light_pcapng_mem *pcapng;
  ulong uVar4;
  size_t size;
  uint8_t *data;
  size_t local_40;
  uint32_t *local_38;
  
  if (1 < argc) {
    uVar4 = 1;
    do {
      file = args[uVar4];
      iVar1 = read_file(file,(uint8_t **)&local_38,&local_40);
      memory = local_38;
      size_00 = local_40;
      if (iVar1 == 0) {
        p0 = light_read_from_memory(local_38,local_40);
        pcapng = light_no_copy_from_memory(memory,size_00,1);
        uVar2 = light_pcapng_validate(p0,pcapng->mem);
        uVar3 = light_pcapng_validate(p0,*pcapng->mem_blocks);
        printf("Internal structure comparison returned %d\n",(ulong)(uVar2 & uVar3));
        light_pcapng_release(p0);
        light_pcapng_mem_release(pcapng);
      }
      else {
        fprintf(_stderr,"Unable to read pcapng: %s\n",file);
      }
      uVar4 = uVar4 + 1;
    } while ((uint)argc != uVar4);
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		uint8_t *data;
		size_t size;
		if (read_file(file, &data, &size) == 0) {
			light_pcapng pcapng0 = light_read_from_memory((uint32_t *)data, size);
			struct _light_pcapng_mem *pcapng1 = light_no_copy_from_memory((uint32_t *)data, size, 1);
			int status = light_pcapng_validate(pcapng0, *(uint32_t **)pcapng1);
			uint32_t **sec = (uint32_t **)(((uint32_t **)pcapng1)[1]);

			status &= light_pcapng_validate(pcapng0, sec[0]);

			printf("Internal structure comparison returned %d\n", status);

			light_pcapng_release(pcapng0);
			light_pcapng_mem_release(pcapng1);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	return 0;
}